

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.h
# Opt level: O0

void __thiscall crnlib::etc1_block::set_selector(etc1_block *this,uint x,uint y,uint val)

{
  byte bVar1;
  byte bVar2;
  uint8 *puVar3;
  byte bVar4;
  uint uVar5;
  uint msb;
  uint lsb;
  uint etc1_val;
  uint mask;
  uint byte_bit_ofs;
  uint8 *p;
  uint bit_index;
  uint val_local;
  uint y_local;
  uint x_local;
  etc1_block *this_local;
  
  uVar5 = x * 4 + y;
  puVar3 = this->m_low_color + ((ulong)(7 - (uVar5 >> 3)) - 8);
  bVar4 = (byte)uVar5 & 7;
  bVar1 = *(byte *)((long)&g_selector_index_to_etc1 + (ulong)val);
  bVar2 = (byte)(1 << bVar4);
  *puVar3 = *puVar3 & (bVar2 ^ 0xff);
  *puVar3 = *puVar3 | (byte)((bVar1 & 1) << bVar4);
  puVar3[-2] = puVar3[-2] & (bVar2 ^ 0xff);
  puVar3[-2] = puVar3[-2] | (bVar1 >> 1) << bVar4;
  return;
}

Assistant:

inline void set_selector(uint x, uint y, uint val)
        {
            CRNLIB_ASSERT((x | y | val) < 4);
            const uint bit_index = x * 4 + y;

            uint8* p = &m_bytes[7 - (bit_index >> 3)];

            const uint byte_bit_ofs = bit_index & 7;
            const uint mask = 1 << byte_bit_ofs;

            const uint etc1_val = g_selector_index_to_etc1[val];

            const uint lsb = etc1_val & 1;
            const uint msb = etc1_val >> 1;

            p[0] &= ~mask;
            p[0] |= (lsb << byte_bit_ofs);

            p[-2] &= ~mask;
            p[-2] |= (msb << byte_bit_ofs);
        }